

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

mpack_tag_t mpack_peek_tag(mpack_reader_t *reader)

{
  anon_union_8_8_6320e492_for_v aVar1;
  anon_union_8_8_6320e492_for_v aVar2;
  ulong uVar3;
  mpack_tag_t mVar4;
  mpack_tag_t tag;
  
  if (reader->error != mpack_ok) {
    return (mpack_tag_t)(ZEXT816(1) << 0x40);
  }
  tag.v.u = 0;
  tag.type = 0;
  tag._12_4_ = 0;
  aVar1.u = mpack_parse_tag(reader,&tag);
  aVar2.u = aVar1.u;
  if (aVar1.u != 0) {
    aVar2 = tag.v;
  }
  uVar3 = 1;
  if (aVar1.u != 0) {
    uVar3 = tag._8_8_ & 0xffffffff;
  }
  mVar4._8_8_ = uVar3;
  mVar4.v.u = aVar2.u;
  return mVar4;
}

Assistant:

mpack_tag_t mpack_peek_tag(mpack_reader_t* reader) {
    mpack_log("peeking tag\n");

    // make sure we can peek a tag
    if (mpack_reader_error(reader) != mpack_ok)
        return mpack_tag_nil();
    if (mpack_reader_track_peek_element(reader) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;
    if (mpack_parse_tag(reader, &tag) == 0)
        return mpack_tag_nil();
    return tag;
}